

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O1

String * __thiscall
kj::_::encodeCEscapeImpl
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_unsigned_char> bytes,bool isBinary)

{
  _ _Var1;
  _ *p_Var2;
  uchar *capacity;
  uint uVar3;
  _ *p_Var4;
  size_t sVar5;
  uchar *puVar6;
  Vector<char> local_68;
  undefined4 local_3c;
  String *local_38;
  
  capacity = bytes.ptr;
  local_3c = (undefined4)bytes.size_;
  local_38 = __return_storage_ptr__;
  local_68.builder.ptr =
       (char *)HeapArrayDisposer::allocateImpl
                         (1,0,(size_t)capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                         );
  local_68.builder.endPtr = (char *)((_ *)local_68.builder.ptr + (long)capacity);
  local_68.builder.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  local_68.builder.pos = local_68.builder.ptr;
  if (capacity != (uchar *)0x0) {
    puVar6 = (uchar *)0x0;
    do {
      _Var1 = this[(long)puVar6];
      uVar3 = (uint)(byte)_Var1;
      if (0x21 < (byte)_Var1) {
        if (_Var1 == (_)0x22) {
          p_Var2 = (_ *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
          if ((_ *)(local_68.builder.endPtr + -(long)local_68.builder.ptr) < p_Var2) {
            p_Var4 = (_ *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              p_Var4 = (_ *)0x4;
            }
            if (p_Var4 < p_Var2) {
              p_Var4 = p_Var2;
            }
            Vector<char>::setCapacity(&local_68,(size_t)p_Var4);
          }
          local_68.builder.pos[0] = '\\';
          local_68.builder.pos[1] = '\"';
        }
        else if (uVar3 == 0x27) {
          p_Var2 = (_ *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
          if ((_ *)(local_68.builder.endPtr + -(long)local_68.builder.ptr) < p_Var2) {
            p_Var4 = (_ *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              p_Var4 = (_ *)0x4;
            }
            if (p_Var4 < p_Var2) {
              p_Var4 = p_Var2;
            }
            Vector<char>::setCapacity(&local_68,(size_t)p_Var4);
          }
          local_68.builder.pos[0] = '\\';
          local_68.builder.pos[1] = '\'';
        }
        else {
          if (uVar3 != 0x5c) goto switchD_00295b75_default;
          p_Var2 = (_ *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
          if ((_ *)(local_68.builder.endPtr + -(long)local_68.builder.ptr) < p_Var2) {
            p_Var4 = (_ *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              p_Var4 = (_ *)0x4;
            }
            if (p_Var4 < p_Var2) {
              p_Var4 = p_Var2;
            }
            Vector<char>::setCapacity(&local_68,(size_t)p_Var4);
          }
          local_68.builder.pos[0] = '\\';
          local_68.builder.pos[1] = '\\';
        }
        goto LAB_00295fd5;
      }
      switch(_Var1) {
      case (_)0x7:
        p_Var2 = (_ *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
        if ((_ *)(local_68.builder.endPtr + -(long)local_68.builder.ptr) < p_Var2) {
          p_Var4 = (_ *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            p_Var4 = (_ *)0x4;
          }
          if (p_Var4 < p_Var2) {
            p_Var4 = p_Var2;
          }
          Vector<char>::setCapacity(&local_68,(size_t)p_Var4);
        }
        local_68.builder.pos[0] = '\\';
        local_68.builder.pos[1] = 'a';
        break;
      case (_)0x8:
        p_Var2 = (_ *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
        if ((_ *)(local_68.builder.endPtr + -(long)local_68.builder.ptr) < p_Var2) {
          p_Var4 = (_ *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            p_Var4 = (_ *)0x4;
          }
          if (p_Var4 < p_Var2) {
            p_Var4 = p_Var2;
          }
          Vector<char>::setCapacity(&local_68,(size_t)p_Var4);
        }
        local_68.builder.pos[0] = '\\';
        local_68.builder.pos[1] = 'b';
        break;
      case (_)0x9:
        p_Var2 = (_ *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
        if ((_ *)(local_68.builder.endPtr + -(long)local_68.builder.ptr) < p_Var2) {
          p_Var4 = (_ *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            p_Var4 = (_ *)0x4;
          }
          if (p_Var4 < p_Var2) {
            p_Var4 = p_Var2;
          }
          Vector<char>::setCapacity(&local_68,(size_t)p_Var4);
        }
        local_68.builder.pos[0] = '\\';
        local_68.builder.pos[1] = 't';
        break;
      case (_)0xa:
        p_Var2 = (_ *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
        if ((_ *)(local_68.builder.endPtr + -(long)local_68.builder.ptr) < p_Var2) {
          p_Var4 = (_ *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            p_Var4 = (_ *)0x4;
          }
          if (p_Var4 < p_Var2) {
            p_Var4 = p_Var2;
          }
          Vector<char>::setCapacity(&local_68,(size_t)p_Var4);
        }
        local_68.builder.pos[0] = '\\';
        local_68.builder.pos[1] = 'n';
        break;
      case (_)0xb:
        p_Var2 = (_ *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
        if ((_ *)(local_68.builder.endPtr + -(long)local_68.builder.ptr) < p_Var2) {
          p_Var4 = (_ *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            p_Var4 = (_ *)0x4;
          }
          if (p_Var4 < p_Var2) {
            p_Var4 = p_Var2;
          }
          Vector<char>::setCapacity(&local_68,(size_t)p_Var4);
        }
        local_68.builder.pos[0] = '\\';
        local_68.builder.pos[1] = 'v';
        break;
      case (_)0xc:
        p_Var2 = (_ *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
        if ((_ *)(local_68.builder.endPtr + -(long)local_68.builder.ptr) < p_Var2) {
          p_Var4 = (_ *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            p_Var4 = (_ *)0x4;
          }
          if (p_Var4 < p_Var2) {
            p_Var4 = p_Var2;
          }
          Vector<char>::setCapacity(&local_68,(size_t)p_Var4);
        }
        local_68.builder.pos[0] = '\\';
        local_68.builder.pos[1] = 'f';
        break;
      case (_)0xd:
        p_Var2 = (_ *)(local_68.builder.pos + (2 - (long)local_68.builder.ptr));
        if ((_ *)(local_68.builder.endPtr + -(long)local_68.builder.ptr) < p_Var2) {
          p_Var4 = (_ *)((long)(local_68.builder.endPtr + -(long)local_68.builder.ptr) * 2);
          if (local_68.builder.endPtr == local_68.builder.ptr) {
            p_Var4 = (_ *)0x4;
          }
          if (p_Var4 < p_Var2) {
            p_Var4 = p_Var2;
          }
          Vector<char>::setCapacity(&local_68,(size_t)p_Var4);
        }
        local_68.builder.pos[0] = '\\';
        local_68.builder.pos[1] = 'r';
        break;
      default:
switchD_00295b75_default:
        if ((byte)((char)_Var1 < '\0' & (byte)local_3c | (_Var1 == (_)0x7f || (byte)_Var1 < 0x20))
            == 1) {
          if (local_68.builder.pos == local_68.builder.endPtr) {
            sVar5 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              sVar5 = 4;
            }
            Vector<char>::setCapacity(&local_68,sVar5);
          }
          *local_68.builder.pos = '\\';
          local_68.builder.pos = local_68.builder.pos + 1;
          if (local_68.builder.pos == local_68.builder.endPtr) {
            sVar5 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              sVar5 = 4;
            }
            Vector<char>::setCapacity(&local_68,sVar5);
          }
          *local_68.builder.pos = (RemoveConst<char>)*(_ *)("0123456789abcdef" + ((byte)_Var1 >> 6))
          ;
          local_68.builder.pos = local_68.builder.pos + 1;
          if (local_68.builder.pos == local_68.builder.endPtr) {
            sVar5 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              sVar5 = 4;
            }
            Vector<char>::setCapacity(&local_68,sVar5);
          }
          *local_68.builder.pos =
               (RemoveConst<char>)*(_ *)("0123456789abcdef" + ((byte)_Var1 >> 3 & 7));
          local_68.builder.pos = local_68.builder.pos + 1;
          if (local_68.builder.pos == local_68.builder.endPtr) {
            sVar5 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              sVar5 = 4;
            }
            Vector<char>::setCapacity(&local_68,sVar5);
          }
          *local_68.builder.pos = (RemoveConst<char>)*(_ *)("0123456789abcdef" + (uVar3 & 7));
        }
        else {
          if (local_68.builder.pos == local_68.builder.endPtr) {
            sVar5 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
            if (local_68.builder.endPtr == local_68.builder.ptr) {
              sVar5 = 4;
            }
            Vector<char>::setCapacity(&local_68,sVar5);
          }
          *local_68.builder.pos = (RemoveConst<char>)_Var1;
        }
        local_68.builder.pos = local_68.builder.pos + 1;
        goto LAB_00295fd9;
      }
LAB_00295fd5:
      local_68.builder.pos = (RemoveConst<char> *)((_ *)local_68.builder.pos + 2);
LAB_00295fd9:
      puVar6 = puVar6 + 1;
    } while (capacity != puVar6);
  }
  if (local_68.builder.pos == local_68.builder.endPtr) {
    sVar5 = 4;
    if (local_68.builder.endPtr != local_68.builder.ptr) {
      sVar5 = ((long)local_68.builder.endPtr - (long)local_68.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&local_68,sVar5);
  }
  *local_68.builder.pos = '\0';
  local_68.builder.pos = local_68.builder.pos + 1;
  if (local_68.builder.pos != local_68.builder.endPtr) {
    Vector<char>::setCapacity(&local_68,(long)local_68.builder.pos - (long)local_68.builder.ptr);
  }
  (local_38->content).ptr = local_68.builder.ptr;
  (local_38->content).size_ = (long)local_68.builder.pos - (long)local_68.builder.ptr;
  (local_38->content).disposer = local_68.builder.disposer;
  return local_38;
}

Assistant:

String encodeCEscapeImpl(ArrayPtr<const byte> bytes, bool isBinary) {
  Vector<char> escaped(bytes.size());

  for (byte b: bytes) {
    switch (b) {
      case '\a': escaped.addAll("\\a"_kj); break;
      case '\b': escaped.addAll("\\b"_kj); break;
      case '\f': escaped.addAll("\\f"_kj); break;
      case '\n': escaped.addAll("\\n"_kj); break;
      case '\r': escaped.addAll("\\r"_kj); break;
      case '\t': escaped.addAll("\\t"_kj); break;
      case '\v': escaped.addAll("\\v"_kj); break;
      case '\'': escaped.addAll("\\\'"_kj); break;
      case '\"': escaped.addAll("\\\""_kj); break;
      case '\\': escaped.addAll("\\\\"_kj); break;
      default:
        if (b < 0x20 || b == 0x7f || (isBinary && b > 0x7f)) {
          // Use octal escape, not hex, because hex escapes technically have no length limit and
          // so can create ambiguity with subsequent characters.
          escaped.add('\\');
          escaped.add(HEX_DIGITS[b / 64]);
          escaped.add(HEX_DIGITS[(b / 8) % 8]);
          escaped.add(HEX_DIGITS[b % 8]);
        } else {
          escaped.add(b);
        }
        break;
    }
  }

  escaped.add(0);
  return String(escaped.releaseAsArray());
}